

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int __thiscall fmt::v7::detail::safe_strerror::dispatcher::run(dispatcher *this)

{
  int iVar1;
  char *message;
  
  message = strerror_r(this->error_code_,*this->buffer_,this->buffer_size_);
  iVar1 = handle(this,message);
  return iVar1;
}

Assistant:

int run() { return handle(strerror_r(error_code_, buffer_, buffer_size_)); }